

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AcousticEmitterSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AcousticEmitterSystem *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  AcousticEmitterSystem *local_18;
  AcousticEmitterSystem *this_local;
  
  local_18 = this;
  this_local = (AcousticEmitterSystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Acoustic Emitter System:");
  poVar1 = std::operator<<(poVar1,"\n\tName:     ");
  ENUMS::GetEnumAsStringAcousticSystemName_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16EmitterName,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tFunction: ");
  ENUMS::GetEnumAsStringAcousticSystemFunction_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui8Function,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tID:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8EmitterIDNumber);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AcousticEmitterSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Acoustic Emitter System:"
       << "\n\tName:     " << GetEnumAsStringAcousticSystemName( m_ui16EmitterName )
       << "\n\tFunction: " << GetEnumAsStringAcousticSystemFunction( m_ui8Function )
       << "\n\tID:       " << ( KUINT16 )m_ui8EmitterIDNumber
       << "\n";

    return ss.str();
}